

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::nextToken(Lexer *this,bool isValueToken)

{
  bool bVar1;
  undefined1 in_DL;
  Token *in_RSI;
  Token *in_RDI;
  char c;
  Lexer *in_stack_00000048;
  Lexer *in_stack_000000e8;
  Lexer *in_stack_000001a8;
  Lexer *in_stack_000003d8;
  Token *this_00;
  undefined3 in_stack_ffffffffffffffec;
  char cVar2;
  TokenType type;
  
  type = CONCAT13(in_DL,in_stack_ffffffffffffffec) & 0x1ffffff;
  this_00 = in_RDI;
  while( true ) {
    while( true ) {
      bVar1 = current((Lexer *)this_00,(char *)in_RDI);
      if (!bVar1) {
        Token::Token(in_RSI,type);
        return this_00;
      }
      cVar2 = (char)(type >> 0x10);
      if (((cVar2 != ' ') && (cVar2 != '\t')) && (cVar2 != '\r')) break;
      next((Lexer *)in_RDI);
    }
    if (cVar2 != '#') break;
    skipUntilNewLine((Lexer *)in_RDI);
  }
  if (cVar2 == '\n') {
    next((Lexer *)in_RDI);
    Token::Token(in_RSI,type);
    return this_00;
  }
  if (cVar2 == '\"') {
    nextStringDoubleQuote(in_stack_000001a8);
    return this_00;
  }
  if (cVar2 == '\'') {
    nextStringSingleQuote(in_stack_000000e8);
    return this_00;
  }
  if (cVar2 == ',') {
    next((Lexer *)in_RDI);
    Token::Token(in_RSI,type);
    return this_00;
  }
  if (cVar2 == '.') {
    next((Lexer *)in_RDI);
    Token::Token(in_RSI,type);
    return this_00;
  }
  if (cVar2 == '=') {
    next((Lexer *)in_RDI);
    Token::Token(in_RSI,type);
    return this_00;
  }
  if (cVar2 != '[') {
    if (cVar2 == ']') {
      next((Lexer *)in_RDI);
      Token::Token(in_RSI,type);
      return this_00;
    }
    if (cVar2 == '{') {
      next((Lexer *)in_RDI);
      Token::Token(in_RSI,type);
      return this_00;
    }
    if (cVar2 == '}') {
      next((Lexer *)in_RDI);
      Token::Token(in_RSI,type);
      return this_00;
    }
    if ((type & 0x1000000) != ERROR_TOKEN) {
      nextValue(in_stack_000003d8);
      return this_00;
    }
    nextKey(in_stack_00000048);
    return this_00;
  }
  next((Lexer *)in_RDI);
  Token::Token(in_RSI,type);
  return this_00;
}

Assistant:

inline Token Lexer::nextToken(bool isValueToken)
{
    char c;
    while (current(&c)) {
        if (c == ' ' || c == '\t' || c == '\r') {
            next();
            continue;
        }

        if (c == '#') {
            skipUntilNewLine();
            continue;
        }

        switch (c) {
        case '\n':
            next();
            return Token(TokenType::END_OF_LINE);
        case '=':
            next();
            return Token(TokenType::EQUAL);
        case '{':
            next();
            return Token(TokenType::LBRACE);
        case '}':
            next();
            return Token(TokenType::RBRACE);
        case '[':
            next();
            return Token(TokenType::LBRACKET);
        case ']':
            next();
            return Token(TokenType::RBRACKET);
        case ',':
            next();
            return Token(TokenType::COMMA);
        case '.':
            next();
            return Token(TokenType::DOT);
        case '\"':
            return nextStringDoubleQuote();
        case '\'':
            return nextStringSingleQuote();
        default:
            if (isValueToken) {
                return nextValue();
            } else {
                return nextKey();
            }
        }
    }

    return Token(TokenType::END_OF_FILE);
}